

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O2

size_t __thiscall io_buf::bin_read_fixed(io_buf *this,char *data,size_t len,char *read_message)

{
  int iVar1;
  size_t len_00;
  uint64_t uVar2;
  vw_exception *this_00;
  char *p;
  string local_1d0;
  stringstream __msg;
  ostream local_1a0;
  
  if (len == 0) {
    len_00 = 0;
  }
  else {
    len_00 = buf_read(this,&p,len);
    if (this->_verify_hash == true) {
      uVar2 = uniform_hash(p,len_00,(ulong)this->_hash);
      this->_hash = (uint32_t)uVar2;
    }
    if (*read_message == '\0') {
      memcpy(data,p,len_00);
    }
    else {
      iVar1 = bcmp(data,p,len_00);
      if (iVar1 != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        std::operator<<(&local_1a0,read_message);
        this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this_00,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/io_buf.h"
                   ,0xf9,&local_1d0);
        __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
  }
  return len_00;
}

Assistant:

size_t bin_read_fixed(char* data, size_t len, const char* read_message)
  {
    if (len > 0)
    {
      char* p;
      // if the model is corrupt the number of bytes can be less then specified (as there isn't enought data available
      // in the file)
      len = buf_read(p, len);

      // compute hash for check-sum
      if (_verify_hash)
        _hash = (uint32_t)uniform_hash(p, len, _hash);

      if (*read_message == '\0')
        memcpy(data, p, len);
      else if (memcmp(data, p, len) != 0)
        THROW(read_message);
      return len;
    }
    return 0;
  }